

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrink.cpp
# Opt level: O1

int __thiscall ncnn::Shrink::forward_inplace(Shrink *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar5 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
          if (-this->lambd <= fVar8) {
            if (this->lambd < fVar8) {
              fVar8 = fVar8 - this->bias;
            }
          }
          else {
            fVar8 = fVar8 + this->bias;
          }
          *(float *)((long)pvVar5 + uVar7 * 4) = fVar8;
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      lVar6 = lVar6 + 1;
      pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int Shrink::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] < -lambd ? ptr[i] + bias : ptr[i] > lambd ? ptr[i] - bias : ptr[i];
        }
    }

    return 0;
}